

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

var __thiscall cs::function::call_rr(function *this,function *_this,vector *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  stack_pointer psVar3;
  _Elt_pointer ppsVar4;
  statement_base *psVar5;
  undefined *puVar6;
  var *pvVar7;
  element_type *peVar8;
  runtime_error *this_00;
  long *plVar9;
  size_type *psVar10;
  pointer paVar11;
  long lVar12;
  _Map_pointer pppsVar13;
  _Elt_pointer ppsVar14;
  stack_pointer this_01;
  ulong uVar15;
  _Elt_pointer ppsVar16;
  long lVar17;
  fcall_guard fcall;
  scope_guard scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [2];
  string local_50;
  
  puVar6 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
  }
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string
              (local_d0,(long)(_this->mArgs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(_this->mArgs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+(local_90,"Wrong size of arguments. Expected ",local_d0);
    plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
    local_130[0]._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_130[0]._M_dataplus._M_p == psVar10) {
      local_130[0].field_2._0_8_ = *psVar10;
      local_130[0].field_2._8_8_ = plVar9[3];
      local_130[0]._M_dataplus._M_p = (pointer)&local_130[0].field_2;
    }
    else {
      local_130[0].field_2._0_8_ = *psVar10;
    }
    local_130[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::to_string
              (&local_50,
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_f0,local_130,&local_50);
    runtime_error::runtime_error(this_00,&local_f0);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  peVar2 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
  this_01 = &(peVar2->super_runtime_type).storage.m_data;
  if (psVar3 != (stack_pointer)0x0) {
    this_01 = psVar3;
  }
  local_f0._M_dataplus._M_p = (pointer)_this;
  stack_type<cs::domain_type,_std::allocator>::push<>(this_01);
  stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
            ((stack_type<cs_impl::any,std::allocator> *)(current_process + 0x80),
             (pointer *)&null_pointer);
  paVar11 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_finish != paVar11) {
    lVar12 = 0;
    lVar17 = 0;
    uVar15 = 0;
    do {
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(((((_this->mContext).
                      super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_runtime_type).storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((_this->mArgs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17),
                 (var *)((long)&paVar11->mDat + lVar12));
      uVar15 = uVar15 + 1;
      paVar11 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x20;
      lVar12 = lVar12 + 8;
    } while (uVar15 < (ulong)((long)(args->
                                    super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 3)
            );
  }
  ppsVar14 = (_this->mBody).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar14 != ppsVar4) {
    ppsVar16 = (_this->mBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    pppsVar13 = (_this->mBody).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar6 = current_process;
      psVar5 = *ppsVar14;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
      }
      (*psVar5->_vptr_statement_base[3])(psVar5);
      peVar2 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar2->return_fcall == true) {
        peVar2->return_fcall = false;
        pvVar7 = fcall_guard::get((fcall_guard *)local_130);
        goto LAB_002b10ce;
      }
      ppsVar14 = ppsVar14 + 1;
      if (ppsVar14 == ppsVar16) {
        ppsVar14 = pppsVar13[1];
        pppsVar13 = pppsVar13 + 1;
        ppsVar16 = ppsVar14 + 0x40;
      }
    } while (ppsVar14 != ppsVar4);
  }
  pvVar7 = fcall_guard::get((fcall_guard *)local_130);
LAB_002b10ce:
  peVar8 = (element_type *)pvVar7->mDat;
  if (peVar8 == (element_type *)0x0) {
    peVar8 = (element_type *)0x0;
  }
  else {
    p_Var1 = &(peVar8->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    p_Var1->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
  }
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
  fcall_guard::~fcall_guard((fcall_guard *)local_130);
  scope_guard::~scope_guard((scope_guard *)&local_f0);
  return (var)(proxy *)this;
}

Assistant:

var function::call_rr(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}